

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactorCvode.cpp
# Opt level: O1

void __thiscall pele::physics::reactions::ReactorCvode::checkCvodeOptions(ReactorCvode *this)

{
  ostringstream *poVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  Context *pCVar8;
  SUNMatrix p_Var9;
  sunindextype *psVar10;
  void *pvVar11;
  ostream *poVar12;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar13;
  int j;
  int iVar14;
  long lVar15;
  size_t sVar16;
  int j_1;
  int iVar17;
  ulong uVar18;
  int HP;
  string prec_type_str;
  string solve_type_str;
  ParmParse ppcv;
  uint local_26c;
  undefined8 local_268;
  string local_260;
  sunindextype *local_240;
  long local_238;
  string local_230;
  undefined1 local_210 [24];
  undefined8 auStack_1f8 [46];
  ParmParse local_88;
  
  if (0 < (this->super_Register<pele::physics::reactions::ReactorCvode>).super_ReactorBase.verbose)
  {
    local_210._8_8_ = amrex::OutStream();
    poVar1 = (ostringstream *)(local_210 + 0x10);
    local_210._4_4_ = *(MPI_Comm *)(DAT_00756620 + -0x48);
    local_210._0_4_ = *(int *)(DAT_00756620 + -0x30);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    *(undefined8 *)((long)auStack_1f8 + *(long *)(local_210._16_8_ - 0x18)) =
         *(undefined8 *)(local_210._8_8_ + *(long *)(*(long *)local_210._8_8_ + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Number of species in mech is ",0x1d);
    std::ostream::operator<<(poVar1,9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
    amrex::Print::~Print((Print *)local_210);
  }
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"none","");
  local_210._0_8_ = local_210 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"cvode","");
  amrex::ParmParse::ParmParse(&local_88,(string *)local_210);
  if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
    operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
  }
  amrex::ParmParse::query(&local_88,"solve_type",&local_230,0);
  iVar6 = std::__cxx11::string::compare((char *)&local_230);
  if (iVar6 == 0) {
    iVar6 = -1;
    if (0 < (this->super_Register<pele::physics::reactions::ReactorCvode>).super_ReactorBase.verbose
       ) {
      local_210._8_8_ = amrex::OutStream();
      local_210._4_4_ = *(undefined4 *)(DAT_00756620 + -0x48);
      local_210._0_4_ = *(undefined4 *)(DAT_00756620 + -0x30);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_210 + 0x10));
      *(undefined8 *)((long)auStack_1f8 + *(long *)(local_210._16_8_ - 0x18)) =
           *(undefined8 *)(local_210._8_8_ + *(long *)(*(long *)local_210._8_8_ + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_210 + 0x10)," Using a fixed-point nonlinear solver\n",0x26);
LAB_0014c008:
      iVar6 = -1;
      amrex::Print::~Print((Print *)local_210);
    }
LAB_0014c012:
    bVar2 = false;
LAB_0014c014:
    bVar3 = false;
    local_268 = (sunindextype *)((ulong)local_268._4_4_ << 0x20);
LAB_0014c01f:
    bVar4 = false;
  }
  else {
    iVar6 = std::__cxx11::string::compare((char *)&local_230);
    if (iVar6 == 0) {
      iVar6 = -1;
      if (0 < (this->super_Register<pele::physics::reactions::ReactorCvode>).super_ReactorBase.
              verbose) {
        local_210._8_8_ = amrex::OutStream();
        local_210._4_4_ = *(undefined4 *)(DAT_00756620 + -0x48);
        local_210._0_4_ = *(undefined4 *)(DAT_00756620 + -0x30);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_210 + 0x10));
        *(undefined8 *)((long)auStack_1f8 + *(long *)(local_210._16_8_ - 0x18)) =
             *(undefined8 *)(local_210._8_8_ + *(long *)(*(long *)local_210._8_8_ + -0x18) + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_210 + 0x10),
                   " Using a dense direct linear solve with Finite Difference Jacobian\n",0x43);
        goto LAB_0014c008;
      }
      goto LAB_0014c012;
    }
    iVar6 = std::__cxx11::string::compare((char *)&local_230);
    if (iVar6 == 0) {
      bVar2 = true;
      iVar6 = -1;
      if (0 < (this->super_Register<pele::physics::reactions::ReactorCvode>).super_ReactorBase.
              verbose) {
        local_210._8_8_ = amrex::OutStream();
        local_210._4_4_ = *(undefined4 *)(DAT_00756620 + -0x48);
        local_210._0_4_ = *(undefined4 *)(DAT_00756620 + -0x30);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_210 + 0x10));
        *(undefined8 *)((long)auStack_1f8 + *(long *)(local_210._16_8_ - 0x18)) =
             *(undefined8 *)(local_210._8_8_ + *(long *)(*(long *)local_210._8_8_ + -0x18) + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_210 + 0x10),
                   " Using a dense direct linear solve with Analytical Jacobian\n",0x3c);
        amrex::Print::~Print((Print *)local_210);
      }
      goto LAB_0014c014;
    }
    iVar6 = std::__cxx11::string::compare((char *)&local_230);
    if (iVar6 == 0) {
      amrex::Abort_host("solver_type sparse_direct requires the KLU library");
      bVar2 = true;
      iVar6 = -1;
      uVar13 = extraout_RAX;
      if (0 < (this->super_Register<pele::physics::reactions::ReactorCvode>).super_ReactorBase.
              verbose) {
        local_210._8_8_ = amrex::OutStream();
        local_210._4_4_ = *(undefined4 *)(DAT_00756620 + -0x48);
        local_210._0_4_ = *(undefined4 *)(DAT_00756620 + -0x30);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_210 + 0x10));
        *(undefined8 *)((long)auStack_1f8 + *(long *)(local_210._16_8_ - 0x18)) =
             *(undefined8 *)(local_210._8_8_ + *(long *)(*(long *)local_210._8_8_ + -0x18) + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_210 + 0x10),
                   " Using a sparse direct linear solve with KLU Analytical Jacobian\n",0x41);
        amrex::Print::~Print((Print *)local_210);
        uVar13 = extraout_RAX_00;
      }
      bVar3 = false;
      local_268 = (sunindextype *)
                  CONCAT44(local_268._4_4_,(int)CONCAT71((int7)((ulong)uVar13 >> 8),1));
      goto LAB_0014c01f;
    }
    iVar6 = std::__cxx11::string::compare((char *)&local_230);
    if (iVar6 == 0) {
      bVar2 = true;
      iVar6 = -1;
      if (0 < (this->super_Register<pele::physics::reactions::ReactorCvode>).super_ReactorBase.
              verbose) {
        poVar12 = amrex::OutStream();
        amrex::Print::Print((Print *)local_210,poVar12);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_210 + 0x10),
                   " Using a sparse custom direct linear solve with Analytical Jacobian\n",0x44);
        amrex::Print::~Print((Print *)local_210);
      }
      local_268 = (sunindextype *)((ulong)local_268._4_4_ << 0x20);
      bVar3 = true;
      goto LAB_0014c01f;
    }
    iVar6 = std::__cxx11::string::compare((char *)&local_230);
    if (iVar6 == 0) {
      iVar6 = -1;
      if (0 < (this->super_Register<pele::physics::reactions::ReactorCvode>).super_ReactorBase.
              verbose) {
        poVar12 = amrex::OutStream();
        amrex::Print::Print((Print *)local_210,poVar12);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_210 + 0x10)," Using a JFNK GMRES linear solve\n",0x21);
        goto LAB_0014c008;
      }
      goto LAB_0014c012;
    }
    iVar6 = std::__cxx11::string::compare((char *)&local_230);
    if (iVar6 == 0) {
      if (0 < (this->super_Register<pele::physics::reactions::ReactorCvode>).super_ReactorBase.
              verbose) {
        poVar12 = amrex::OutStream();
        amrex::Print::Print((Print *)local_210,poVar12);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_210 + 0x10)," Using a JFNK GMRES linear solve",0x20);
        amrex::Print::~Print((Print *)local_210);
      }
      local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"none","");
      amrex::ParmParse::query(&local_88,"precond_type",&local_260,0);
      iVar6 = std::__cxx11::string::compare((char *)&local_260);
      if (iVar6 == 0) {
        poVar12 = amrex::OutStream();
        amrex::Print::Print((Print *)local_210,poVar12);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_210 + 0x10)," with a dense simplified AJ-based preconditioner",
                   0x30);
        amrex::Print::~Print((Print *)local_210);
        iVar6 = 0;
      }
      else {
        iVar6 = std::__cxx11::string::compare((char *)&local_260);
        if (iVar6 == 0) {
          amrex::Abort_host("precond_type sparse_simplified_AJacobian requires the KLU library");
          poVar12 = amrex::OutStream();
          amrex::Print::Print((Print *)local_210,poVar12);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_210 + 0x10),
                     " with a sparse simplified AJ-based preconditioner",0x31);
          amrex::Print::~Print((Print *)local_210);
          iVar6 = 1;
        }
        else {
          iVar6 = std::__cxx11::string::compare((char *)&local_260);
          if (iVar6 == 0) {
            poVar12 = amrex::OutStream();
            amrex::Print::Print((Print *)local_210,poVar12);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_210 + 0x10),
                       " with a custom simplified AJ-based preconditioner",0x31);
            amrex::Print::~Print((Print *)local_210);
            iVar6 = 2;
          }
          else {
            iVar6 = -1;
            amrex::Abort_host(
                             "Wrong precond_type. Options are: \'dense_simplified_AJacobian\', \'sparse_simplified_AJacobian\', \'custom_simplified_AJacobian\'"
                             );
          }
        }
      }
      poVar12 = amrex::OutStream();
      amrex::Print::Print((Print *)local_210,poVar12);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_210 + 0x10),"\n",1);
      amrex::Print::~Print((Print *)local_210);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != &local_260.field_2) {
        operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0014c012;
    }
    iVar7 = std::__cxx11::string::compare((char *)&local_230);
    iVar6 = -1;
    if (iVar7 != 0) {
      amrex::Abort_host(
                       "Wrong solve_type. Options are: \'dense_direct\', denseAJ_direct\', \'sparse_direct\', \'custom_direct\', \'GMRES\', \'precGMRES\', \'fixed_point\'"
                       );
      iVar6 = -1;
      goto LAB_0014c012;
    }
    bVar4 = true;
    bVar2 = false;
    bVar3 = false;
    local_268 = (sunindextype *)((ulong)local_268 & 0xffffffff00000000);
  }
  if (iVar6 == 2) {
    local_26c = (uint)(this->m_reactor_type == 2);
    SPARSITY_INFO_SYST_SIMPLIFIED((int *)&local_260,(int *)&local_26c);
    if ((this->super_Register<pele::physics::reactions::ReactorCvode>).super_ReactorBase.verbose < 1
       ) goto LAB_0014c1fb;
    local_210._8_8_ = amrex::OutStream();
    poVar1 = (ostringstream *)(local_210 + 0x10);
    local_210._4_4_ = *(undefined4 *)(DAT_00756620 + -0x48);
    local_210._0_4_ = *(undefined4 *)(DAT_00756620 + -0x30);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    *(undefined8 *)((long)auStack_1f8 + *(long *)(local_210._16_8_ - 0x18)) =
         *(undefined8 *)(local_210._8_8_ + *(long *)(*(long *)local_210._8_8_ + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "--> custom sparse AJ based matrix Preconditioner -- non zero entries: ",0x46);
    std::ostream::operator<<(poVar1,(uint)local_260._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", which represents ",0x13)
    ;
    std::ostream::_M_insert<double>(((double)(int)(uint)local_260._M_dataplus._M_p / 100.0) * 100.0)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1," % fill-in pattern\n",0x13);
  }
  else {
    if (iVar6 != 1) goto LAB_0014c1fb;
    local_26c = (uint)(this->m_reactor_type == 2);
    SPARSITY_INFO_SYST_SIMPLIFIED((int *)&local_260,(int *)&local_26c);
    if ((this->super_Register<pele::physics::reactions::ReactorCvode>).super_ReactorBase.verbose < 1
       ) goto LAB_0014c1fb;
    local_210._8_8_ = amrex::OutStream();
    poVar1 = (ostringstream *)(local_210 + 0x10);
    local_210._4_4_ = *(undefined4 *)(DAT_00756620 + -0x48);
    local_210._0_4_ = *(undefined4 *)(DAT_00756620 + -0x30);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    *(undefined8 *)((long)auStack_1f8 + *(long *)(local_210._16_8_ - 0x18)) =
         *(undefined8 *)(local_210._8_8_ + *(long *)(*(long *)local_210._8_8_ + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "--> KLU sparse AJ based matrix Preconditioner -- non zero entries: ",0x43);
    std::ostream::operator<<(poVar1,(uint)local_260._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", which represents ",0x13)
    ;
    std::ostream::_M_insert<double>(((double)(int)(uint)local_260._M_dataplus._M_p / 100.0) * 100.0)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1," % fill-in pattern\n",0x13);
  }
  amrex::Print::~Print((Print *)local_210);
LAB_0014c1fb:
  if (bVar2) {
    local_26c = (uint)(this->m_reactor_type == 2);
    if (bVar3) {
      SPARSITY_INFO_SYST((int *)&local_260,(int *)&local_26c,1);
      if (0 < (this->super_Register<pele::physics::reactions::ReactorCvode>).super_ReactorBase.
              verbose) {
        local_210._8_8_ = amrex::OutStream();
        poVar1 = (ostringstream *)(local_210 + 0x10);
        local_210._4_4_ = *(undefined4 *)(DAT_00756620 + -0x48);
        local_210._0_4_ = *(undefined4 *)(DAT_00756620 + -0x30);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        *(undefined8 *)((long)auStack_1f8 + *(long *)(local_210._16_8_ - 0x18)) =
             *(undefined8 *)(local_210._8_8_ + *(long *)(*(long *)local_210._8_8_ + -0x18) + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   "--> sparse AJ-based matrix custom Solver -- non zero entries: ",0x3e);
        std::ostream::operator<<(poVar1,(uint)local_260._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,", which represents ",0x13);
        std::ostream::_M_insert<double>
                  (((double)(int)(uint)local_260._M_dataplus._M_p / 100.0) * 100.0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1," % fill-in pattern\n",0x13);
        amrex::Print::~Print((Print *)local_210);
      }
    }
    else if ((char)local_268 != '\0') {
      amrex::Abort_host(
                       "solver_type \'sparseDirect\' uses a sparse KLU matrix and requires the KLU library"
                       );
    }
  }
  if (bVar4) {
    local_260._M_dataplus._M_p._0_4_ = (uint)(this->m_reactor_type == 2);
    local_26c = 0;
    SPARSITY_INFO((int *)&local_26c,(int *)&local_260,1);
    local_210._8_8_ = amrex::OutStream();
    poVar1 = (ostringstream *)(local_210 + 0x10);
    local_210._4_4_ = *(MPI_Comm *)(DAT_00756620 + -0x48);
    local_210._0_4_ = *(int *)(DAT_00756620 + -0x30);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    *(undefined8 *)((long)auStack_1f8 + *(long *)(local_210._16_8_ - 0x18)) =
         *(undefined8 *)(local_210._8_8_ + *(long *)(*(long *)local_210._8_8_ + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"--> Chem. Jac -- non zero entries: ",0x23);
    std::ostream::operator<<(poVar1,local_26c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", which represents ",0x13)
    ;
    std::ostream::_M_insert<double>(((double)(int)local_26c / 100.0) * 100.0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1," % fill-in pattern\n",0x13);
    amrex::Print::~Print((Print *)local_210);
    uVar5 = local_26c;
    pCVar8 = amrex::sundials::The_Sundials_Context(0);
    p_Var9 = SUNSparseMatrix(10,10,uVar5,1,
                             *(pCVar8->sunctx_)._M_t.
                              super___uniq_ptr_impl<_SUNContext_*,_std::default_delete<_SUNContext_*>_>
                              ._M_t.
                              super__Tuple_impl<0UL,__SUNContext_**,_std::default_delete<_SUNContext_*>_>
                              .super__Head_base<0UL,__SUNContext_**,_false>._M_head_impl);
    local_268 = SUNSparseMatrix_IndexPointers(p_Var9);
    psVar10 = SUNSparseMatrix_IndexValues(p_Var9);
    SPARSITY_PREPROC_CSR(psVar10,local_268,(int *)&local_260,1,0);
    local_210._8_8_ = amrex::OutStream();
    local_210._4_4_ = *(MPI_Comm *)(DAT_00756620 + -0x48);
    local_210._0_4_ = *(int *)(DAT_00756620 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_210 + 0x10));
    *(undefined8 *)((long)auStack_1f8 + *(long *)(local_210._16_8_ - 0x18)) =
         *(undefined8 *)(local_210._8_8_ + *(long *)(*(long *)local_210._8_8_ + -0x18) + 8);
    local_240 = psVar10;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_210 + 0x10),
               "\n\n *** Treating CHEM Jac (CSR symbolic analysis)*** \n\n",0x36);
    amrex::Print::~Print((Print *)local_210);
    lVar15 = 0;
    iVar6 = 0;
    while (lVar15 != 10) {
      uVar18 = (long)local_268[lVar15 + 1] - (long)local_268[lVar15];
      iVar7 = (int)uVar18;
      sVar16 = uVar18 * 4;
      if (iVar7 < 0) {
        sVar16 = 0xffffffffffffffff;
      }
      pvVar11 = operator_new__(sVar16);
      if (0 < iVar7) {
        memset(pvVar11,0xff,(uVar18 & 0xffffffff) << 2);
      }
      local_238 = lVar15 + 1;
      memcpy(pvVar11,local_240 + local_268[lVar15],uVar18 * 4);
      iVar14 = 0;
      iVar17 = 0;
      do {
        if ((iVar7 < 1) || (iVar14 != *(int *)((long)pvVar11 + (long)iVar17 * 4))) {
          poVar12 = (ostream *)std::ostream::operator<<(&std::cout,0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
        }
        else {
          poVar12 = (ostream *)std::ostream::operator<<(&std::cout,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
          iVar17 = iVar17 + 1;
          iVar6 = iVar6 + 1;
        }
        iVar14 = iVar14 + 1;
      } while (iVar14 != 10);
      operator_delete__(pvVar11);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
      lVar15 = local_238;
      std::ostream::put(-0x80);
      std::ostream::flush();
    }
    local_210._8_8_ = amrex::OutStream();
    poVar1 = (ostringstream *)(local_210 + 0x10);
    local_210._4_4_ = *(MPI_Comm *)(DAT_00756620 + -0x48);
    local_210._0_4_ = *(int *)(DAT_00756620 + -0x30);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    *(undefined8 *)((long)auStack_1f8 + *(long *)(local_210._16_8_ - 0x18)) =
         *(undefined8 *)(local_210._8_8_ + *(long *)(*(long *)local_210._8_8_ + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," There was ",0xb);
    std::ostream::operator<<(poVar1,iVar6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1," non zero elems (compared to the ",0x21);
    std::ostream::operator<<(poVar1,local_26c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," we need) \n",0xb);
    amrex::Print::~Print((Print *)local_210);
    SPARSITY_INFO_SYST((int *)&local_26c,(int *)&local_260,1);
    local_210._8_8_ = amrex::OutStream();
    poVar1 = (ostringstream *)(local_210 + 0x10);
    local_210._4_4_ = *(MPI_Comm *)(DAT_00756620 + -0x48);
    local_210._0_4_ = *(int *)(DAT_00756620 + -0x30);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    *(undefined8 *)((long)auStack_1f8 + *(long *)(local_210._16_8_ - 0x18)) =
         *(undefined8 *)(local_210._8_8_ + *(long *)(*(long *)local_210._8_8_ + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"--> Syst. Jac -- non zero entries: ",0x23);
    std::ostream::operator<<(poVar1,local_26c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", which represents ",0x13)
    ;
    std::ostream::_M_insert<double>(((double)(int)local_26c / 100.0) * 100.0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1," % fill-in pattern\n",0x13);
    amrex::Print::~Print((Print *)local_210);
    uVar5 = local_26c;
    pCVar8 = amrex::sundials::The_Sundials_Context(0);
    p_Var9 = SUNSparseMatrix(10,10,uVar5,1,
                             *(pCVar8->sunctx_)._M_t.
                              super___uniq_ptr_impl<_SUNContext_*,_std::default_delete<_SUNContext_*>_>
                              ._M_t.
                              super__Tuple_impl<0UL,__SUNContext_**,_std::default_delete<_SUNContext_*>_>
                              .super__Head_base<0UL,__SUNContext_**,_false>._M_head_impl);
    local_268 = SUNSparseMatrix_IndexPointers(p_Var9);
    psVar10 = SUNSparseMatrix_IndexValues(p_Var9);
    SPARSITY_PREPROC_SYST_CSR(psVar10,local_268,(int *)&local_260,1,1);
    local_210._8_8_ = amrex::OutStream();
    local_210._4_4_ = *(MPI_Comm *)(DAT_00756620 + -0x48);
    local_210._0_4_ = *(int *)(DAT_00756620 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_210 + 0x10));
    *(undefined8 *)((long)auStack_1f8 + *(long *)(local_210._16_8_ - 0x18)) =
         *(undefined8 *)(local_210._8_8_ + *(long *)(*(long *)local_210._8_8_ + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_210 + 0x10),
               "\n\n *** Treating SYST Jac (CSR symbolic analysis)*** \n\n",0x36);
    amrex::Print::~Print((Print *)local_210);
    local_240 = psVar10 + -1;
    lVar15 = 0;
    iVar6 = 0;
    while (lVar15 != 10) {
      uVar18 = (long)local_268[lVar15 + 1] - (long)local_268[lVar15];
      iVar7 = (int)uVar18;
      sVar16 = uVar18 * 4;
      if (iVar7 < 0) {
        sVar16 = 0xffffffffffffffff;
      }
      pvVar11 = operator_new__(sVar16);
      if (0 < iVar7) {
        memset(pvVar11,0xff,(uVar18 & 0xffffffff) << 2);
      }
      local_238 = lVar15 + 1;
      memcpy(pvVar11,local_240 + local_268[lVar15],uVar18 * 4);
      iVar17 = 0;
      iVar14 = 0;
      do {
        if ((iVar17 == *(int *)((long)pvVar11 + (long)iVar14 * 4) + -1) && (iVar14 < iVar7)) {
          poVar12 = (ostream *)std::ostream::operator<<(&std::cout,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
          iVar14 = iVar14 + 1;
          iVar6 = iVar6 + 1;
        }
        else {
          poVar12 = (ostream *)std::ostream::operator<<(&std::cout,0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
        }
        iVar17 = iVar17 + 1;
      } while (iVar17 != 10);
      operator_delete__(pvVar11);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
      lVar15 = local_238;
      std::ostream::put(-0x80);
      std::ostream::flush();
    }
    local_210._8_8_ = amrex::OutStream();
    poVar1 = (ostringstream *)(local_210 + 0x10);
    local_210._4_4_ = *(MPI_Comm *)(DAT_00756620 + -0x48);
    local_210._0_4_ = *(int *)(DAT_00756620 + -0x30);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    *(undefined8 *)((long)auStack_1f8 + *(long *)(local_210._16_8_ - 0x18)) =
         *(undefined8 *)(local_210._8_8_ + *(long *)(*(long *)local_210._8_8_ + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," There was ",0xb);
    std::ostream::operator<<(poVar1,iVar6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1," non zero elems (compared to the ",0x21);
    std::ostream::operator<<(poVar1,local_26c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," we need) \n",0xb);
    amrex::Print::~Print((Print *)local_210);
    SPARSITY_INFO_SYST_SIMPLIFIED((int *)&local_26c,(int *)&local_260);
    local_210._8_8_ = amrex::OutStream();
    poVar1 = (ostringstream *)(local_210 + 0x10);
    local_210._4_4_ = *(MPI_Comm *)(DAT_00756620 + -0x48);
    local_210._0_4_ = *(int *)(DAT_00756620 + -0x30);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    *(undefined8 *)((long)auStack_1f8 + *(long *)(local_210._16_8_ - 0x18)) =
         *(undefined8 *)(local_210._8_8_ + *(long *)(*(long *)local_210._8_8_ + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"--> Simplified Syst Jac (for Precond) -- non zero entries: ",0x3b)
    ;
    std::ostream::operator<<(poVar1,local_26c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", which represents ",0x13)
    ;
    std::ostream::_M_insert<double>(((double)(int)local_26c / 100.0) * 100.0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1," % fill-in pattern\n",0x13);
    amrex::Print::~Print((Print *)local_210);
    uVar5 = local_26c;
    pCVar8 = amrex::sundials::The_Sundials_Context(0);
    p_Var9 = SUNSparseMatrix(10,10,uVar5,1,
                             *(pCVar8->sunctx_)._M_t.
                              super___uniq_ptr_impl<_SUNContext_*,_std::default_delete<_SUNContext_*>_>
                              ._M_t.
                              super__Tuple_impl<0UL,__SUNContext_**,_std::default_delete<_SUNContext_*>_>
                              .super__Head_base<0UL,__SUNContext_**,_false>._M_head_impl);
    local_268 = SUNSparseMatrix_IndexPointers(p_Var9);
    psVar10 = SUNSparseMatrix_IndexValues(p_Var9);
    SPARSITY_PREPROC_SYST_SIMPLIFIED_CSR(psVar10,local_268,(int *)&local_260,1);
    local_210._8_8_ = amrex::OutStream();
    local_210._4_4_ = *(MPI_Comm *)(DAT_00756620 + -0x48);
    local_210._0_4_ = *(int *)(DAT_00756620 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_210 + 0x10));
    *(undefined8 *)((long)auStack_1f8 + *(long *)(local_210._16_8_ - 0x18)) =
         *(undefined8 *)(local_210._8_8_ + *(long *)(*(long *)local_210._8_8_ + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_210 + 0x10),
               "\n\n *** Treating simplified SYST Jac (CSR symbolic analysis)*** \n\n",0x41);
    amrex::Print::~Print((Print *)local_210);
    local_240 = psVar10 + -1;
    lVar15 = 0;
    iVar6 = 0;
    while (lVar15 != 10) {
      uVar18 = (long)local_268[lVar15 + 1] - (long)local_268[lVar15];
      iVar7 = (int)uVar18;
      sVar16 = uVar18 * 4;
      if (iVar7 < 0) {
        sVar16 = 0xffffffffffffffff;
      }
      pvVar11 = operator_new__(sVar16);
      if (0 < iVar7) {
        memset(pvVar11,0xff,(uVar18 & 0xffffffff) << 2);
      }
      local_238 = lVar15 + 1;
      memcpy(pvVar11,local_240 + local_268[lVar15],uVar18 * 4);
      iVar17 = 0;
      iVar14 = 0;
      do {
        if ((iVar17 == *(int *)((long)pvVar11 + (long)iVar14 * 4) + -1) && (iVar14 < iVar7)) {
          poVar12 = (ostream *)std::ostream::operator<<(&std::cout,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
          iVar14 = iVar14 + 1;
          iVar6 = iVar6 + 1;
        }
        else {
          poVar12 = (ostream *)std::ostream::operator<<(&std::cout,0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
        }
        iVar17 = iVar17 + 1;
      } while (iVar17 != 10);
      operator_delete__(pvVar11);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
      lVar15 = local_238;
      std::ostream::put(-0x80);
      std::ostream::flush();
    }
    local_210._8_8_ = amrex::OutStream();
    poVar1 = (ostringstream *)(local_210 + 0x10);
    local_210._4_4_ = *(undefined4 *)(DAT_00756620 + -0x48);
    local_210._0_4_ = *(undefined4 *)(DAT_00756620 + -0x30);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    *(undefined8 *)((long)auStack_1f8 + *(long *)(local_210._16_8_ - 0x18)) =
         *(undefined8 *)(local_210._8_8_ + *(long *)(*(long *)local_210._8_8_ + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," There was ",0xb);
    std::ostream::operator<<(poVar1,iVar6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1," non zero elems (compared to the ",0x21);
    std::ostream::operator<<(poVar1,local_26c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," we need) \n",0xb);
    amrex::Print::~Print((Print *)local_210);
    amrex::Abort_host("Chemistry sparsity pattern dumped -> exiting now !");
  }
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
ReactorCvode::checkCvodeOptions() const
{
  if (verbose > 0) {
    amrex::Print() << "Number of species in mech is " << NUM_SPECIES << "\n";
  }

  std::string solve_type_str = "none";
  amrex::ParmParse ppcv("cvode");
  ppcv.query("solve_type", solve_type_str);
  int solve_type = -1;
  int analytical_jacobian = 0;
  int precond_type = -1;

#ifdef AMREX_USE_GPU
  if (solve_type_str == "fixed_point") {
    solve_type = cvode::fixedPoint;
    analytical_jacobian = 0;
    if (verbose > 0)
      amrex::Print() << " Using a fixed-point nonlinear solver\n";
  } else if (solve_type_str == "sparse_direct") {
    solve_type = cvode::sparseDirect;
    analytical_jacobian = 1;
#ifdef AMREX_USE_CUDA
    if (verbose > 0)
      amrex::Print()
        << " Using a cuSparse direct linear solve with analytical Jacobian\n";
#else
    amrex::Abort("solve_type 'sparse_direct' only available with CUDA");
#endif
  } else if (solve_type_str == "custom_direct") {
    solve_type = cvode::customDirect;
    analytical_jacobian = 1;
#ifdef AMREX_USE_CUDA
    if (verbose > 0)
      amrex::Print()
        << " Using a custom direct linear solve with analytical Jacobian\n";
#else
    amrex::Abort("solve_type 'custom_direct' only available with CUDA");
#endif
  } else if (solve_type_str == "magma_direct") {
    solve_type = cvode::magmaDirect;
    analytical_jacobian = 1;
#ifdef PELE_USE_MAGMA
    if (verbose > 0)
      amrex::Print() << " Using MAGMA direct linear solve\n";
#else
    amrex::Abort(
      "solve_type 'magma_direct' only available with if PELE_USE_MAGMA true");
#endif
  } else if (solve_type_str == "GMRES") {
    solve_type = cvode::GMRES;
    if (verbose > 0)
      amrex::Print() << " Using a JFNK GMRES linear solve\n";
  } else if (solve_type_str == "precGMRES") {
    solve_type = cvode::precGMRES;
    if (verbose > 0)
      amrex::Print() << " Using a JFNK GMRES linear solve";
    std::string prec_type_str = "cuSparse_simplified_AJacobian";
    ppcv.query("precond_type", prec_type_str);
    if (prec_type_str == "cuSparse_simplified_AJacobian") {
      precond_type = cvode::sparseSimpleAJac;
#ifdef AMREX_USE_CUDA
      amrex::Print() << " with a cuSparse simplified AJ-based preconditioner";
#else
      amrex::Abort(
        "precond_type 'cuSparse_simplified_AJacobian' only available with "
        "CUDA");
#endif
    } else {
      amrex::Abort(
        "Wrong precond_type. Only option is: 'cuSparse_simplified_AJacobian'");
    }
    amrex::Print() << "\n";
  } else {
    amrex::Abort(
      "Wrong solve_type. Options are: 'sparse_direct', 'custom_direct', "
      "'GMRES', 'precGMRES', 'fixed_point'");
  }

#else
  if (solve_type_str == "fixed_point") {
    solve_type = cvode::fixedPoint;
    analytical_jacobian = 0;
    if (verbose > 0)
      amrex::Print() << " Using a fixed-point nonlinear solver\n";
  } else if (solve_type_str == "dense_direct") {
    solve_type = cvode::denseFDDirect;
    if (verbose > 0) {
      amrex::Print()
        << " Using a dense direct linear solve with Finite Difference "
           "Jacobian\n";
    }
  } else if (solve_type_str == "denseAJ_direct") {
    solve_type = cvode::denseDirect;
    analytical_jacobian = 1;
    if (verbose > 0) {
      amrex::Print()
        << " Using a dense direct linear solve with Analytical Jacobian\n";
    }
  } else if (solve_type_str == "sparse_direct") {
    solve_type = cvode::sparseDirect;
    analytical_jacobian = 1;
#ifndef PELE_USE_KLU
    amrex::Abort("solver_type sparse_direct requires the KLU library");
#endif
    if (verbose > 0) {
      amrex::Print()
        << " Using a sparse direct linear solve with KLU Analytical Jacobian\n";
    }
  } else if (solve_type_str == "custom_direct") {
    solve_type = cvode::customDirect;
    analytical_jacobian = 1;
    if (verbose > 0) {
      amrex::Print()
        << " Using a sparse custom direct linear solve with Analytical "
           "Jacobian\n";
    }
  } else if (solve_type_str == "GMRES") {
    solve_type = cvode::GMRES;
    if (verbose > 0) {
      amrex::Print() << " Using a JFNK GMRES linear solve\n";
    }
  } else if (solve_type_str == "precGMRES") {
    solve_type = cvode::precGMRES;
    if (verbose > 0) {
      amrex::Print() << " Using a JFNK GMRES linear solve";
    }
    std::string prec_type_str = "none";
    ppcv.query("precond_type", prec_type_str);
    if (prec_type_str == "dense_simplified_AJacobian") {
      precond_type = cvode::denseSimpleAJac;
      amrex::Print() << " with a dense simplified AJ-based preconditioner";
    } else if (prec_type_str == "sparse_simplified_AJacobian") {
      precond_type = cvode::sparseSimpleAJac;
#ifndef PELE_USE_KLU
      amrex::Abort(
        "precond_type sparse_simplified_AJacobian requires the KLU library");
#endif
      amrex::Print() << " with a sparse simplified AJ-based preconditioner";
    } else if (prec_type_str == "custom_simplified_AJacobian") {
      precond_type = cvode::customSimpleAJac;
      amrex::Print() << " with a custom simplified AJ-based preconditioner";
    } else {
      amrex::Abort(
        "Wrong precond_type. Options are: 'dense_simplified_AJacobian', "
        "'sparse_simplified_AJacobian', 'custom_simplified_AJacobian'");
    }
    amrex::Print() << "\n";
  } else if (solve_type_str == "diagnostic") {
    solve_type = cvode::hackDumpSparsePattern;
  } else {
    amrex::Abort(
      "Wrong solve_type. Options are: 'dense_direct', denseAJ_direct', "
      "'sparse_direct', 'custom_direct', 'GMRES', 'precGMRES', 'fixed_point'");
  }
#endif

  // Print additionnal information
  if (precond_type == cvode::sparseSimpleAJac) {
    int nJdata;
    const int HP =
      static_cast<int>(m_reactor_type == ReactorTypes::h_reactor_type);
    // Simplified AJ precond data
#ifdef AMREX_USE_GPU
#if defined(AMREX_USE_CUDA)
    SPARSITY_INFO_SYST_SIMPLIFIED(&nJdata, &HP);
    if (verbose > 0) {
      amrex::Print()
        << "--> cuSparse AJ based matrix Preconditioner -- non zero entries: "
        << nJdata << ", which represents "
        << static_cast<amrex::Real>(nJdata) /
             static_cast<amrex::Real>((NUM_SPECIES + 1) * (NUM_SPECIES + 1)) *
             100.0
        << " % fill-in pattern\n";
    }
#elif defined(AMREX_USE_HIP)
    amrex::Abort(
      "\n--> precond_type sparse simplified_AJacobian not available with "
      "HIP \n");
#elif defined(AMREX_USE_DPCPP)
    amrex::Abort(
      "\n--> precond_type sparse simplified_AJacobian not available with "
      "DPCPP \n");
#endif

#else
    SPARSITY_INFO_SYST_SIMPLIFIED(&nJdata, &HP);
    if (verbose > 0) {
      amrex::Print()
        << "--> KLU sparse AJ based matrix Preconditioner -- non zero entries: "
        << nJdata << ", which represents "
        << static_cast<amrex::Real>(nJdata) /
             static_cast<amrex::Real>((NUM_SPECIES + 1) * (NUM_SPECIES + 1)) *
             100.0
        << " % fill-in pattern\n";
    }
#endif
#ifndef AMREX_USE_GPU
  } else if (precond_type == cvode::customSimpleAJac) {
    int nJdata;
    const int HP =
      static_cast<int>(m_reactor_type == ReactorTypes::h_reactor_type);
    // Simplified AJ precond data
    SPARSITY_INFO_SYST_SIMPLIFIED(&nJdata, &HP);
    if (verbose > 0) {
      amrex::Print()
        << "--> custom sparse AJ based matrix Preconditioner -- non zero "
           "entries: "
        << nJdata << ", which represents "
        << static_cast<amrex::Real>(nJdata) /
             static_cast<amrex::Real>((NUM_SPECIES + 1) * (NUM_SPECIES + 1)) *
             100.0
        << " % fill-in pattern\n";
    }
#endif
  }

  if (analytical_jacobian == 1) {
    int nJdata;
    const int HP =
      static_cast<int>(m_reactor_type == ReactorTypes::h_reactor_type);
    int ncells = 1; // Print the pattern of the diagonal block. ncells will
                    // actually vary on GPU.
#ifdef AMREX_USE_GPU
    if (solve_type == cvode::sparseDirect) {
#if defined(AMREX_USE_CUDA)
      SPARSITY_INFO_SYST(&nJdata, &HP, ncells);
      if (verbose > 0) {
        amrex::Print()
          << "--> cuSparse based matrix Solver -- non zero entries: " << nJdata
          << ", which represents "
          << static_cast<amrex::Real>(nJdata) /
               static_cast<amrex::Real>((NUM_SPECIES + 1) * (NUM_SPECIES + 1)) *
               100.0
          << " % fill-in pattern\n";
      }
#elif defined(AMREX_USE_HIP)
      amrex::Abort("\n--> Analytical Jacobian not available with HIP. Change "
                   "solve_type.\n");
#elif defined(AMREX_USE_DPCPP)
      amrex::Abort("\n--> Analytical Jacobian not available with DPCPP. Change "
                   "solve_type.\n");
#endif
    }

#else
    if (solve_type == cvode::customDirect) {
      SPARSITY_INFO_SYST(&nJdata, &HP, ncells);
      if (verbose > 0) {
        amrex::Print()
          << "--> sparse AJ-based matrix custom Solver -- non zero entries: "
          << nJdata << ", which represents "
          << static_cast<amrex::Real>(nJdata) /
               static_cast<amrex::Real>((NUM_SPECIES + 1) * (NUM_SPECIES + 1)) *
               100.0
          << " % fill-in pattern\n";
      }
    } else if (solve_type == cvode::sparseDirect) {
#ifdef PELE_USE_KLU
      SPARSITY_INFO(&nJdata, &HP, ncells);
      if (verbose > 0) {
        amrex::Print()
          << "--> KLU sparse AJ-based matrix Solver -- non zero entries: "
          << nJdata << ", which represents "
          << static_cast<amrex::Real>(nJdata) /
               static_cast<amrex::Real>((NUM_SPECIES + 1) * (NUM_SPECIES + 1)) *
               100.0
          << " % fill-in pattern\n";
      }
#else
      amrex::Abort(
        "solver_type 'sparseDirect' uses a sparse KLU matrix and requires "
        "the KLU library");
#endif
    }
#endif
  }

#ifndef AMREX_USE_GPU
  if (solve_type == cvode::hackDumpSparsePattern) {
    // This is a diagnostic option -> dump sparsity pattern and abort.
    // Reactor type
    const int HP =
      static_cast<int>(m_reactor_type == ReactorTypes::h_reactor_type);

    // CHEMISTRY JAC
    int nJdata = 0;
    SPARSITY_INFO(&nJdata, &HP, 1);
    amrex::Print() << "--> Chem. Jac -- non zero entries: " << nJdata
                   << ", which represents "
                   << static_cast<amrex::Real>(nJdata) /
                        static_cast<amrex::Real>(
                          (NUM_SPECIES + 1) * (NUM_SPECIES + 1)) *
                        100.0
                   << " % fill-in pattern\n";
    SUNMatrix PS;
    PS = SUNSparseMatrix(
      (NUM_SPECIES + 1), (NUM_SPECIES + 1), nJdata, CSR_MAT,
      *amrex::sundials::The_Sundials_Context());
    auto* rowCount = static_cast<int*>(SUNSparseMatrix_IndexPointers(PS));
    auto* colIdx = static_cast<int*>(SUNSparseMatrix_IndexValues(PS));
    SPARSITY_PREPROC_CSR(colIdx, rowCount, &HP, 1, 0);
    amrex::Print()
      << "\n\n *** Treating CHEM Jac (CSR symbolic analysis)*** \n\n";
    int counter = 0;
    for (int i = 0; i < NUM_SPECIES + 1; i++) {
      int nbVals = rowCount[i + 1] - rowCount[i];
      int* idx_arr = new int[nbVals];
      std::fill_n(idx_arr, nbVals, -1);
      std::memcpy(idx_arr, colIdx + rowCount[i], nbVals * sizeof(int));
      int idx = 0;
      for (int j = 0; j < NUM_SPECIES + 1; j++) {
        if ((j == idx_arr[idx]) && (nbVals > 0)) {
          std::cout << 1 << " ";
          idx = idx + 1;
          counter = counter + 1;
        } else {
          std::cout << 0 << " ";
        }
      }
      delete[] idx_arr;
      std::cout << std::endl;
    }
    amrex::Print() << " There was " << counter
                   << " non zero elems (compared to the " << nJdata
                   << " we need) \n";

    // SYST JAC
    SPARSITY_INFO_SYST(&nJdata, &HP, 1);
    amrex::Print() << "--> Syst. Jac -- non zero entries: " << nJdata
                   << ", which represents "
                   << static_cast<amrex::Real>(nJdata) /
                        static_cast<amrex::Real>(
                          (NUM_SPECIES + 1) * (NUM_SPECIES + 1)) *
                        100.0
                   << " % fill-in pattern\n";
    PS = SUNSparseMatrix(
      (NUM_SPECIES + 1), (NUM_SPECIES + 1), nJdata, CSR_MAT,
      *amrex::sundials::The_Sundials_Context());
    rowCount = static_cast<int*>(SUNSparseMatrix_IndexPointers(PS));
    colIdx = static_cast<int*>(SUNSparseMatrix_IndexValues(PS));
    SPARSITY_PREPROC_SYST_CSR(colIdx, rowCount, &HP, 1, 1);
    amrex::Print()
      << "\n\n *** Treating SYST Jac (CSR symbolic analysis)*** \n\n";
    counter = 0;
    for (int i = 0; i < NUM_SPECIES + 1; i++) {
      int nbVals = rowCount[i + 1] - rowCount[i];
      int* idx_arr = new int[nbVals];
      std::fill_n(idx_arr, nbVals, -1);
      std::memcpy(idx_arr, colIdx + (rowCount[i] - 1), nbVals * sizeof(int));
      int idx = 0;
      for (int j = 0; j < NUM_SPECIES + 1; j++) {
        if ((j == idx_arr[idx] - 1) && ((nbVals - idx) > 0)) {
          std::cout << 1 << " ";
          idx = idx + 1;
          counter = counter + 1;
        } else {
          std::cout << 0 << " ";
        }
      }
      delete[] idx_arr;
      std::cout << std::endl;
    }
    amrex::Print() << " There was " << counter
                   << " non zero elems (compared to the " << nJdata
                   << " we need) \n";

    // SYST JAC SIMPLIFIED
    SPARSITY_INFO_SYST_SIMPLIFIED(&nJdata, &HP);
    amrex::Print()
      << "--> Simplified Syst Jac (for Precond) -- non zero entries: " << nJdata
      << ", which represents "
      << static_cast<amrex::Real>(nJdata) /
           static_cast<amrex::Real>((NUM_SPECIES + 1) * (NUM_SPECIES + 1)) *
           100.0
      << " % fill-in pattern\n";
    PS = SUNSparseMatrix(
      (NUM_SPECIES + 1), (NUM_SPECIES + 1), nJdata, CSR_MAT,
      *amrex::sundials::The_Sundials_Context());
    rowCount = static_cast<int*>(SUNSparseMatrix_IndexPointers(PS));
    colIdx = static_cast<int*>(SUNSparseMatrix_IndexValues(PS));
    SPARSITY_PREPROC_SYST_SIMPLIFIED_CSR(colIdx, rowCount, &HP, 1);
    amrex::Print() << "\n\n *** Treating simplified SYST Jac (CSR symbolic "
                      "analysis)*** \n\n";
    counter = 0;
    for (int i = 0; i < NUM_SPECIES + 1; i++) {
      int nbVals = rowCount[i + 1] - rowCount[i];
      int* idx_arr = new int[nbVals];
      std::fill_n(idx_arr, nbVals, -1);
      std::memcpy(idx_arr, colIdx + (rowCount[i] - 1), nbVals * sizeof(int));
      int idx = 0;
      for (int j = 0; j < NUM_SPECIES + 1; j++) {
        if ((j == idx_arr[idx] - 1) && ((nbVals - idx) > 0)) {
          std::cout << 1 << " ";
          idx = idx + 1;
          counter = counter + 1;
        } else {
          std::cout << 0 << " ";
        }
      }
      delete[] idx_arr;
      std::cout << std::endl;
    }
    amrex::Print() << " There was " << counter
                   << " non zero elems (compared to the " << nJdata
                   << " we need) \n";

    amrex::Abort("Chemistry sparsity pattern dumped -> exiting now !");
  }
#endif
}